

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O3

void __thiscall
QtPromisePrivate::PromiseResolver<int>::PromiseResolver
          (PromiseResolver<int> *this,QPromise<int> *promise)

{
  Data *pDVar1;
  QPromise<int> *pQVar2;
  
  pDVar1 = (Data *)operator_new(0x10);
  (pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x0;
  pDVar1->promise = (QPromise<int> *)0x0;
  (this->m_d).d = pDVar1;
  LOCK();
  (pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar2 = (QPromise<int> *)operator_new(0x10);
  (pQVar2->super_QPromiseBase<int>).m_d.d = (promise->super_QPromiseBase<int>).m_d.d;
  (promise->super_QPromiseBase<int>).m_d.d = (PromiseData<int> *)0x0;
  (pQVar2->super_QPromiseBase<int>)._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001268e8;
  ((this->m_d).d)->promise = pQVar2;
  return;
}

Assistant:

PromiseResolver(QtPromise::QPromise<T> promise) : m_d{new Data{}}
    {
        m_d->promise = new QtPromise::QPromise<T>{std::move(promise)};
    }